

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O3

sequence * toml::detail::syntax::zero_prefixable_int(sequence *__return_storage_ptr__,spec *s)

{
  pointer __p;
  repeat_at_least local_d0;
  either local_b8;
  digit local_98;
  __uniq_ptr_impl<toml::detail::either,_std::default_delete<toml::detail::either>_> local_80;
  sequence local_78;
  character local_58;
  digit local_48;
  digit local_30;
  
  local_98.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_00560750;
  local_98.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_0055f920;
  local_98.scanner_.from_ = '0';
  local_98.scanner_.to_ = '9';
  local_30.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_00560750;
  local_30.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_0055f920;
  local_30.scanner_.from_ = '0';
  local_30.scanner_.to_ = '9';
  local_58.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_0055f860;
  local_58.value_ = '_';
  local_48.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__digit_00560750;
  local_48.scanner_.super_scanner_base._vptr_scanner_base =
       (_func_int **)&PTR__scanner_base_0055f920;
  local_48.scanner_.from_ = '0';
  local_48.scanner_.to_ = '9';
  sequence::sequence<toml::detail::character,toml::detail::syntax::digit>
            (&local_78,&local_58,&local_48);
  either::either<toml::detail::syntax::digit,toml::detail::sequence>(&local_b8,&local_30,&local_78);
  local_d0.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__repeat_at_least_0055fad8;
  local_d0.length_ = 0;
  local_d0.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       operator_new(0x20);
  *(undefined ***)
   local_d0.other_.scanner_._M_t.
   super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
   ._M_t.
   super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
   .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl = &PTR__either_0055fa28;
  *(pointer *)
   ((long)local_d0.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 8) =
       local_b8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)local_d0.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x10) =
       local_b8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)local_d0.other_.scanner_._M_t.
          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
          ._M_t.
          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl + 0x18) =
       local_b8.others_.
       super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.others_.
  super__Vector_base<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80._M_t.
  super__Tuple_impl<0UL,_toml::detail::either_*,_std::default_delete<toml::detail::either>_>.
  super__Head_base<0UL,_toml::detail::either_*,_false>._M_head_impl =
       (tuple<toml::detail::either_*,_std::default_delete<toml::detail::either>_>)
       (_Tuple_impl<0UL,_toml::detail::either_*,_std::default_delete<toml::detail::either>_>)0x0;
  std::unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_>::~unique_ptr
            ((unique_ptr<toml::detail::either,_std::default_delete<toml::detail::either>_> *)
             &local_80);
  sequence::sequence<toml::detail::syntax::digit,toml::detail::repeat_at_least>
            (__return_storage_ptr__,&local_98,&local_d0);
  if (local_d0.other_.scanner_._M_t.
      super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
      ._M_t.
      super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
      .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl !=
      (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_d0.other_.scanner_._M_t.
                          super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
                          .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl +
                8))();
  }
  local_d0.other_.scanner_._M_t.
  super___uniq_ptr_impl<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
  ._M_t.
  super__Tuple_impl<0UL,_toml::detail::scanner_base_*,_std::default_delete<toml::detail::scanner_base>_>
  .super__Head_base<0UL,_toml::detail::scanner_base_*,_false>._M_head_impl =
       (unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>)
       (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
        )0x0;
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_b8.others_);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector(&local_78.others_);
  return __return_storage_ptr__;
}

Assistant:

TOML11_INLINE sequence zero_prefixable_int(const spec& s)
{
    return sequence(
            digit(s),
            repeat_at_least(0,
                either(
                    digit(s),
                    sequence(character('_'), digit(s))
                )
            )
        );
}